

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O2

uint64_t highwayhash::(anonymous_namespace)::RunHighway<2u>(void *param_1,size_t size)

{
  HHResult64 result;
  HHStateT<2U> state;
  char in [1024];
  uint64_t local_490;
  HHStateSSE41 local_488;
  char local_408 [1024];
  
  local_408[0] = (char)size;
  local_488.v0L.v_[0] = -0x24192a2a01b331d1;
  local_488.v0L.v_[1] = -0x5bf6c7ddd660ce2f;
  local_488.v0H.v_[0] = 0x13198a2e03707346;
  local_488.v0H.v_[1] = 0x243f6a8885a308d0;
  local_488.v1L.v_[0] = 0x3bd39e10cb0ef593;
  local_488.v1L.v_[1] = -0x3f530e974a0e7574;
  local_488.v1H.v_[0] = -0x41ab9932cb16f394;
  local_488.v1H.v_[1] = 0x452821e538d01377;
  local_488.mul0L.v_[0] = -0x24192a2a01b331d1;
  local_488.mul0L.v_[1] = -0x5bf6c7ddd660ce30;
  local_488.mul0H.v_[0] = 0x13198a2e03707344;
  local_488.mul0H.v_[1] = 0x243f6a8885a308d3;
  local_488.mul1L.v_[0] = 0x3bd39e10cb0ef593;
  local_488.mul1L.v_[1] = -0x3f530e964a0e7574;
  local_488.mul1H.v_[0] = -0x41ab9930cb16f394;
  local_488.mul1H.v_[1] = 0x452821e638d01377;
  HighwayHashT<highwayhash::SSE41::HHStateSSE41,unsigned_long>(&local_488,local_408,size,&local_490)
  ;
  return local_490;
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}